

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

bool __thiscall capnp::compiler::Declaration::Reader::hasDocComment(Reader *this)

{
  bool bVar1;
  uint ptrIndex;
  PointerReader local_30;
  Reader *local_10;
  Reader *this_local;
  
  local_10 = this;
  ptrIndex = bounded<4u>();
  capnp::_::StructReader::getPointerField(&local_30,&this->_reader,ptrIndex);
  bVar1 = capnp::_::PointerReader::isNull(&local_30);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

inline bool Declaration::Reader::hasDocComment() const {
  return !_reader.getPointerField(
      ::capnp::bounded<4>() * ::capnp::POINTERS).isNull();
}